

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_reporter.h
# Opt level: O1

void __thiscall
bandit::detail::progress_reporter::context_starting(progress_reporter *this,char *desc)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  allocator local_31;
  _List_node_base *local_30;
  _List_node_base *local_28;
  _List_node_base local_20;
  
  std::__cxx11::string::string((string *)&local_30,desc,&local_31);
  p_Var2 = (_List_node_base *)operator_new(0x30);
  p_Var2[1]._M_next = p_Var2 + 2;
  if (local_30 == &local_20) {
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_20._M_next._1_7_,local_20._M_next._0_1_);
    p_Var2[2]._M_prev = local_20._M_prev;
  }
  else {
    p_Var2[1]._M_next = local_30;
    p_Var2[2]._M_next = (_List_node_base *)CONCAT71(local_20._M_next._1_7_,local_20._M_next._0_1_);
  }
  p_Var2[1]._M_prev = local_28;
  local_28 = (_List_node_base *)0x0;
  local_20._M_next._0_1_ = 0;
  local_30 = &local_20;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->contexts_).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_30 != &local_20) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

virtual void context_starting(const char* desc) 
    {
      contexts_.push_back(std::string(desc));
    }